

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O0

void check_style_improve(CHAR_DATA *ch,int style,int multiplier)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  char test [4608];
  int i;
  int gn;
  int skill;
  int sn;
  int chance;
  undefined4 in_stack_ffffffffffffedb8;
  int in_stack_ffffffffffffedbc;
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede8;
  int in_stack_ffffffffffffedec;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  int local_24;
  
  if ((in_ESI != 0) && (in_ESI < 100)) {
    iVar4 = skill_lookup((char *)in_stack_ffffffffffffedc8);
    iVar5 = get_curr_stat(in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
    sVar1 = int_app[iVar5].learn;
    sVar2 = *(short *)(in_RDI + 0x138);
    iVar5 = number_range((int)in_stack_ffffffffffffedc0,in_stack_ffffffffffffedbc);
    if (iVar5 <= sVar2 * 2 + (sVar1 * 10) / (in_EDX << 2)) {
      *(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)iVar4 * 2) =
           *(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)iVar4 * 2) + 1;
      if (100 < *(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)iVar4 * 2)) {
        *(undefined2 *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)iVar4 * 2) = 100;
      }
      for (local_24 = 0; local_24 < 0x26; local_24 = local_24 + 1) {
        iVar5 = skill_lookup((char *)in_stack_ffffffffffffedc8);
        if ((((0 < iVar5) && (iVar5 = gn_skill_lookup((int)in_stack_ffffffffffffedc0), 1 < iVar5))
            && (bVar3 = str_prefix((char *)CONCAT44(in_stack_ffffffffffffedec,
                                                    in_stack_ffffffffffffede8),
                                   in_stack_ffffffffffffede0), !bVar3)) &&
           (*(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)iVar4 * 2) ==
            style_percent[local_24].percent)) {
          in_stack_ffffffffffffedc0 = &stack0xffffffffffffedd8;
          in_stack_ffffffffffffedc8 =
               (CHAR_DATA *)get_char_color(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
          in_stack_ffffffffffffedd0 = style_table[in_ESI].name;
          pcVar6 = END_COLOR(in_stack_ffffffffffffedc8);
          sprintf(in_stack_ffffffffffffedc0,
                  "%sYou make a breakthrough in your understanding of the %s style!%s",
                  in_stack_ffffffffffffedc8,in_stack_ffffffffffffedd0,pcVar6);
          act(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
              (void *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8),0);
          sprintf(&stack0xffffffffffffedd8,"You feel ready to learn the %s skill.",
                  style_percent[local_24].name);
          act(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
              (void *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8),0);
        }
      }
    }
  }
  return;
}

Assistant:

void check_style_improve(CHAR_DATA *ch, int style, int multiplier)
{
	int chance, sn, skill, gn, i;
	char test[MSL];

	if (style == 0 || style >= 100)
		return;

	sn = skill_lookup(style_table[style].name);
	chance = 10 * int_app[get_curr_stat(ch, STAT_INT)].learn;
	chance /= (multiplier * 4);
	chance += ch->level * 2;

	if (number_range(1, 1000) > chance)
		return;

	ch->pcdata->learned[sn]++;

	if (ch->pcdata->learned[sn] > 100)
		ch->pcdata->learned[sn] = 100;

	/* check for newly learned style skills */
	for (i = 0; i < MAX_STYLE_SKILL; i++)
	{
		skill = skill_lookup(style_percent[i].name);

		if (skill > 0)
		{
			gn = gn_skill_lookup(skill);

			if (gn > 1)
			{
				if (!str_prefix(group_table[gn].name, style_table[style].name))
				{
					if (ch->pcdata->learned[sn] == style_percent[i].percent)
					{
						sprintf(test, "%sYou make a breakthrough in your understanding of the %s style!%s",
							get_char_color(ch, "lightyellow"),
							style_table[style].name,
							END_COLOR(ch));
						act(test, ch, 0, 0, TO_CHAR);

						sprintf(test, "You feel ready to learn the %s skill.", style_percent[i].name);
						act(test, ch, 0, 0, TO_CHAR);
					}
				}
			}
		}
	}
}